

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JESPtype.cpp
# Opt level: O0

string * JESPtype::SoftPrint_abi_cxx11_(JESP_t type)

{
  undefined8 uVar1;
  int in_ESI;
  string *in_RDI;
  undefined4 in_stack_ffffffffffffffd8;
  E *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  if (in_ESI == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8,
               (allocator<char> *)in_stack_ffffffffffffffe0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffff3);
  }
  else {
    if (in_ESI != 1) {
      uVar1 = __cxa_allocate_exception(0x28);
      E::E(in_stack_ffffffffffffffe0,(char *)CONCAT44(in_ESI,in_stack_ffffffffffffffd8));
      __cxa_throw(uVar1,&E::typeinfo,E::~E);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8,
               (allocator<char> *)in_stack_ffffffffffffffe0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe3);
  }
  return in_RDI;
}

Assistant:

std::string JESPtype::SoftPrint(JESP_t type)
{
    switch(type)
    {
    case JESPExhaustive:
        return("JESPExh");
        break;
    case JESPDP:
        return("JESPDP");
        break;
    }

    throw(E("JESPtype::SoftPrint invalid type"));

    return("INVALID_JESP_TYPE");
}